

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixRandomness(sqlite3_vfs *NotUsed,int nBuf,char *zBuf)

{
  __pid_t _Var1;
  int *piVar2;
  bool bVar3;
  time_t local_38;
  time_t t;
  uint local_28;
  int got;
  int fd;
  int pid;
  char *zBuf_local;
  sqlite3_vfs *psStack_10;
  int nBuf_local;
  sqlite3_vfs *NotUsed_local;
  
  _fd = (time_t *)zBuf;
  zBuf_local._4_4_ = nBuf;
  psStack_10 = NotUsed;
  memset(zBuf,0,(long)nBuf);
  local_28 = robust_open("/dev/urandom",0,0);
  if ((int)local_28 < 0) {
    time(&local_38);
    *_fd = local_38;
    _Var1 = getpid();
    *(__pid_t *)(_fd + 1) = _Var1;
    zBuf_local._4_4_ = 0xc;
  }
  else {
    do {
      t._4_4_ = (*aSyscall[8].pCurrent)((ulong)local_28,_fd,(long)zBuf_local._4_4_);
      bVar3 = false;
      if (t._4_4_ < 0) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    robust_close((unixFile *)0x0,local_28,0x71b0);
  }
  return zBuf_local._4_4_;
}

Assistant:

static int unixRandomness(sqlite3_vfs *NotUsed, int nBuf, char *zBuf){
  UNUSED_PARAMETER(NotUsed);
  assert((size_t)nBuf>=(sizeof(time_t)+sizeof(int)));

  /* We have to initialize zBuf to prevent valgrind from reporting
  ** errors.  The reports issued by valgrind are incorrect - we would
  ** prefer that the randomness be increased by making use of the
  ** uninitialized space in zBuf - but valgrind errors tend to worry
  ** some users.  Rather than argue, it seems easier just to initialize
  ** the whole array and silence valgrind, even if that means less randomness
  ** in the random seed.
  **
  ** When testing, initializing zBuf[] to zero is all we do.  That means
  ** that we always use the same random number sequence.  This makes the
  ** tests repeatable.
  */
  memset(zBuf, 0, nBuf);
#if !defined(SQLITE_TEST)
  {
    int pid, fd, got;
    fd = robust_open("/dev/urandom", O_RDONLY, 0);
    if( fd<0 ){
      time_t t;
      time(&t);
      memcpy(zBuf, &t, sizeof(t));
      pid = getpid();
      memcpy(&zBuf[sizeof(t)], &pid, sizeof(pid));
      assert( sizeof(t)+sizeof(pid)<=(size_t)nBuf );
      nBuf = sizeof(t) + sizeof(pid);
    }else{
      do{ got = osRead(fd, zBuf, nBuf); }while( got<0 && errno==EINTR );
      robust_close(0, fd, __LINE__);
    }
  }
#endif
  return nBuf;
}